

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# function.cxx
# Opt level: O1

Function * __thiscall Function::setXRange(Function *this,double min,double max,double step)

{
  this->dXMin = min;
  this->dXMax = max;
  this->dXStep = step;
  if (this->xLeft != (Function *)0x0) {
    (*(this->xLeft->super_Physical)._vptr_Physical[0xe])(min,max,step);
  }
  if (this->xRight != (Function *)0x0) {
    (*(this->xRight->super_Physical)._vptr_Physical[0xe])(min,max,step);
  }
  if (this->xPlus != (Function *)0x0) {
    (*(this->xPlus->super_Physical)._vptr_Physical[0xe])(min,max,step);
  }
  return this;
}

Assistant:

Function &Function::setXRange(double min, double max, double step)
{
	dXMin = min;
	dXMax = max;
	dXStep = step;
        if (xLeft) xLeft->setXRange(min, max, step);
        if (xRight) xRight->setXRange(min, max, step);
        if (xPlus) xPlus->setXRange(min, max, step);
	return *this;
}